

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O1

int sortMoves(moves *moveList,int bestMove)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int aiStack_38 [2];
  
  uVar1 = moveList->count;
  lVar2 = (long)aiStack_38 - ((ulong)uVar1 * 4 + 0xf & 0xfffffffffffffff0);
  if (0 < (int)uVar1) {
    uVar10 = 0;
    uVar12 = 5;
    if (side == 0) {
      uVar12 = 0xb;
    }
    uVar11 = 6;
    if (side != 0) {
      uVar11 = uVar10;
    }
    uVar7 = (uint)uVar11;
    if ((uint)uVar11 <= uVar12) {
      uVar7 = uVar12;
    }
    lVar13 = (long)ply;
    iVar9 = scorePV;
    do {
      uVar12 = moveList->moves[uVar10];
      iVar3 = 30000;
      if (uVar12 != bestMove) {
        if ((iVar9 == 0) || (pvTable[0][lVar13] != uVar12)) {
          if ((uVar12 >> 0x14 & 1) == 0) {
            iVar3 = 9000;
            if ((killerMoves[0][lVar13] != uVar12) &&
               (iVar3 = 8000, killerMoves[1][lVar13] != uVar12)) {
              iVar3 = *(int *)((long)historyMoves[0] +
                              (ulong)(uVar12 >> 4 & 0xfc) + (ulong)(uVar12 >> 4 & 0xf00));
            }
          }
          else {
            uVar4 = uVar11;
            do {
              if ((bitboardsPieces[uVar4] & 1L << ((byte)(uVar12 >> 6) & 0x3f)) != 0)
              goto LAB_0010aca2;
              uVar4 = uVar4 + 1;
            } while (uVar7 + 1 != uVar4);
            uVar4 = 0;
LAB_0010aca2:
            iVar3 = *(int *)((long)MVV_LVA[0] + uVar4 * 4 + (ulong)((uVar12 >> 0xc & 0xf) * 0x30)) +
                    10000;
          }
        }
        else {
          scorePV = 0;
          iVar9 = 0;
          iVar3 = 20000;
        }
      }
      *(int *)(lVar2 + uVar10 * 4) = iVar3;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  if (0 < moveList->count) {
    lVar5 = 1;
    lVar13 = 0;
    do {
      lVar6 = lVar13 + 1;
      lVar8 = lVar5;
      if (lVar6 < moveList->count) {
        do {
          iVar9 = *(int *)(lVar2 + lVar13 * 4);
          iVar3 = *(int *)(lVar2 + lVar8 * 4);
          if (iVar9 < iVar3) {
            *(int *)(lVar2 + lVar13 * 4) = iVar3;
            *(int *)(lVar2 + lVar8 * 4) = iVar9;
            iVar9 = moveList->moves[lVar13];
            moveList->moves[lVar13] = moveList->moves[lVar8];
            moveList->moves[lVar8] = iVar9;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < moveList->count);
      }
      lVar5 = lVar5 + 1;
      lVar13 = lVar6;
    } while (lVar6 < moveList->count);
  }
  return (int)lVar2;
}

Assistant:

static inline int sortMoves(moves *moveList,int bestMove) {
    int moveScores[moveList->count];
    for (int i = 0; i < moveList->count; i++) {
        // if best move -> give A LOT of score
        if(bestMove == moveList->moves[i]){
            moveScores[i] = 30000;
        }
        else{
            // for each move, calculate score
            moveScores[i] = scoreMove(moveList->moves[i]);
        }
    }


    // bubble sort according to score. bigger score first, smaller score last
    for (int current_move = 0; current_move < moveList->count; current_move++) {
        for (int next_move = current_move + 1; next_move < moveList->count; next_move++) {

            if (moveScores[current_move] < moveScores[next_move]) {
                // swap scores
                int tempScore = moveScores[current_move];
                moveScores[current_move] = moveScores[next_move];
                moveScores[next_move] = tempScore;

                // swap moves
                int tempMove = moveList->moves[current_move];
                moveList->moves[current_move] = moveList->moves[next_move];
                moveList->moves[next_move] = tempMove;
            }
        }
    }
    return 1;
}